

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O1

Tag embree::SceneGraph::typeTagOfString(string *ty)

{
  int iVar1;
  runtime_error *this;
  Tag TVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = std::__cxx11::string::compare((char *)ty);
  TVar2 = PTY_CHAR;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)ty);
    TVar2 = PTY_CHAR;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)ty);
      TVar2 = PTY_UCHAR;
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)ty);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)ty);
          TVar2 = PTY_SHORT;
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)ty);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare((char *)ty);
              TVar2 = PTY_USHORT;
              if (iVar1 != 0) {
                iVar1 = std::__cxx11::string::compare((char *)ty);
                if (iVar1 != 0) {
                  iVar1 = std::__cxx11::string::compare((char *)ty);
                  TVar2 = PTY_INT;
                  if (iVar1 != 0) {
                    iVar1 = std::__cxx11::string::compare((char *)ty);
                    if (iVar1 != 0) {
                      iVar1 = std::__cxx11::string::compare((char *)ty);
                      TVar2 = PTY_UINT;
                      if (iVar1 != 0) {
                        iVar1 = std::__cxx11::string::compare((char *)ty);
                        if (iVar1 != 0) {
                          iVar1 = std::__cxx11::string::compare((char *)ty);
                          TVar2 = PTY_FLOAT;
                          if (iVar1 != 0) {
                            iVar1 = std::__cxx11::string::compare((char *)ty);
                            if (iVar1 != 0) {
                              iVar1 = std::__cxx11::string::compare((char *)ty);
                              TVar2 = PTY_DOUBLE;
                              if (iVar1 != 0) {
                                this = (runtime_error *)__cxa_allocate_exception(0x10);
                                std::operator+(&bStack_38,"invalid type ",ty);
                                std::runtime_error::runtime_error(this,(string *)&bStack_38);
                                __cxa_throw(this,&std::runtime_error::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return TVar2;
}

Assistant:

Type::Tag typeTagOfString(const std::string& ty) {
      if (ty == "char") return Type::PTY_CHAR;
      if (ty == "int8") return Type::PTY_CHAR;
      if (ty == "uchar") return Type::PTY_UCHAR;
      if (ty == "uint8") return Type::PTY_UCHAR;
      if (ty == "short") return Type::PTY_SHORT;
      if (ty == "int16") return Type::PTY_SHORT;
      if (ty == "ushort") return Type::PTY_USHORT;
      if (ty == "uint16") return Type::PTY_USHORT;
      if (ty == "int") return Type::PTY_INT;
      if (ty == "int32") return Type::PTY_INT;
      if (ty == "uint") return Type::PTY_UINT;
      if (ty == "uint32") return Type::PTY_UINT;
      if (ty == "float") return Type::PTY_FLOAT;
      if (ty == "float32") return Type::PTY_FLOAT;
      if (ty == "double") return Type::PTY_DOUBLE;
      throw std::runtime_error("invalid type " + ty);
      return Type::PTY_NONE;
    }